

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O1

void __thiscall
solitaire::piles::EmptyFoundationPileTest_tryAddAce_Test::TestBody
          (EmptyFoundationPileTest_tryAddAce_Test *this)

{
  void *pvVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer *__ptr;
  char *pcVar3;
  initializer_list<solitaire::cards::Card> __l;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  optional<solitaire::cards::Card> cardToAdd;
  Cards pileCards;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  pointer local_88;
  AssertHelper local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_70;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_58;
  _Storage<solitaire::cards::Card,_true> local_40;
  char local_38;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_30;
  
  solitaire::cards::Card::Card((Card *)local_98,Ace,Heart);
  __l._M_len = 1;
  __l._M_array = (iterator)local_98;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_30,__l,(allocator_type *)&local_70);
  local_40 = *(_Storage<solitaire::cards::Card,_true> *)
              local_30.
              super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_38 = '\x01';
  (*(((this->super_EmptyFoundationPileTest).pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[4])();
  if (local_38 == '\0') {
    testing::AssertionSuccess();
  }
  else {
    testing::internal::CmpHelperEQFailure<std::optional<solitaire::cards::Card>,std::nullopt_t>
              ((internal *)local_98,"cardToAdd","std::nullopt",
               (optional<solitaire::cards::Card> *)&local_40._M_value,(nullopt_t *)&std::nullopt);
  }
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_70.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_70.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_98,
             &local_30);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_58,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_98);
  pvVar1 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_88 - (long)pvVar1);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_98,
             &local_58);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_70,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_98);
  pvVar1 = (void *)CONCAT71(local_98._1_7_,local_98[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_88 - (long)pvVar1);
  }
  (*(((this->super_EmptyFoundationPileTest).pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&local_80,(char *)&local_70,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  if (local_70.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_80.data_ == '\0') {
    testing::Message::Message((Message *)local_98);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if ((long *)CONCAT71(local_98._1_7_,local_98[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_98._1_7_,local_98[0]) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  iVar2 = (*(((this->super_EmptyFoundationPileTest).pile.
              super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_FoundationPile).super_Archiver._vptr_Archiver[7])();
  local_70.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
  local_80.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<std::optional<solitaire::cards::Value>,solitaire::cards::Value>
            ((internal *)local_98,"pile->getTopCardValue()","Value::Ace",
             (optional<solitaire::cards::Value> *)&local_70,(Value *)&local_80);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_70.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((long)*local_70.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  if ((_Storage<solitaire::cards::Card,_true> *)
      local_30.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (_Storage<solitaire::cards::Card,_true> *)0x0) {
    operator_delete(local_30.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(EmptyFoundationPileTest, tryAddAce) {
    const Cards pileCards {
        Card {Value::Ace, Suit::Heart}
    };

    std::optional<Card> cardToAdd = pileCards.front();

    pile->tryAddCard(cardToAdd);

    EXPECT_EQ(cardToAdd, std::nullopt);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getTopCardValue(), Value::Ace);
}